

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void TDPParseTrace(FILE *TraceFILE,char *zTracePrompt)

{
  FILE **ppFVar1;
  
  yyTraceFILE = TraceFILE;
  yyTracePrompt = zTracePrompt;
  if (TraceFILE == (FILE *)0x0) {
    ppFVar1 = (FILE **)&yyTracePrompt;
  }
  else {
    if (zTracePrompt != (char *)0x0) {
      return;
    }
    ppFVar1 = &yyTraceFILE;
  }
  *ppFVar1 = (FILE *)0x0;
  return;
}

Assistant:

void TDPParseTrace(FILE * TraceFILE, char * zTracePrompt) {
	yyTraceFILE = TraceFILE;
	yyTracePrompt = zTracePrompt;

	if ( yyTraceFILE == 0 ) {
		yyTracePrompt = 0;
	} else if ( yyTracePrompt == 0 ) {
		yyTraceFILE = 0;
	}
}